

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O1

void CreateJsRTContext_TTDCallback(void *runtimeHandle,ScriptContext **result)

{
  ScriptContext *pSVar1;
  JsrtContext *context;
  JsErrorCode JVar2;
  undefined1 auStack_38 [8];
  TTDRecorder dummyActionEntryPopper;
  JsrtContext *local_20;
  JsContextRef newContext;
  
  local_20 = (JsrtContext *)0x0;
  *result = (ScriptContext *)0x0;
  auStack_38 = (undefined1  [8])0x0;
  dummyActionEntryPopper.m_actionEvent = (EventLogEntry *)0x0;
  JVar2 = CreateContextCore(runtimeHandle,(TTDRecorder *)auStack_38,false,false,true,&local_20);
  context = local_20;
  if (JVar2 == JsNoError) {
    pSVar1 = (((local_20->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
    *result = pSVar1;
    Js::JavascriptLibrary::SetNativeHostPromiseContinuationFunction
              ((pSVar1->super_ScriptContextBase).javascriptLibrary,
               TTDDummyPromiseContinuationCallback,(void *)0x0);
    JsrtContext::TrySetCurrent(context);
    return;
  }
  TTDAbort_unrecoverable_error("Shouldn\'t fail on us!!!");
}

Assistant:

void CALLBACK CreateJsRTContext_TTDCallback(void* runtimeHandle, Js::ScriptContext** result)
{
    JsContextRef newContext = nullptr;
    *result = nullptr;

    TTDRecorder dummyActionEntryPopper;
    JsErrorCode err = CreateContextCore(static_cast<JsRuntimeHandle>(runtimeHandle), dummyActionEntryPopper, false /*inRecordMode*/, false /*activelyRecording*/, true /*inReplayMode*/, &newContext);
    TTDAssert(err == JsNoError, "Shouldn't fail on us!!!");

    *result = static_cast<JsrtContext*>(newContext)->GetScriptContext();
    (*result)->GetLibrary()->SetNativeHostPromiseContinuationFunction((Js::JavascriptLibrary::PromiseContinuationCallback)TTDDummyPromiseContinuationCallback, nullptr);

    //To ensure we have a valid context active (when we next try and inflate into this context) set this as active by convention
    JsrtContext::TrySetCurrent(static_cast<JsrtContext*>(newContext));
}